

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall kratos::Simulator::process_stmt(Simulator *this,SwitchStmt *switch_,Var *var)

{
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *this_00;
  long lVar1;
  int iVar2;
  _Base_ptr p_Var3;
  const_iterator cVar4;
  __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Rb_tree_header *p_Var6;
  optional<unsigned_long> oVar7;
  key_type local_68;
  Simulator *local_50;
  undefined1 auStack_48 [8];
  mapped_type stmt;
  
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_48,
             &(switch_->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  local_50 = this;
  oVar7 = get_value_(this,(Var *)auStack_48);
  this_00 = &switch_->body_;
  if (((undefined1  [16])
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    auStack_48 = (undefined1  [8])0x0;
    stmt.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    cVar4 = std::
            _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
            ::find(&this_00->_M_t,(key_type *)auStack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
    if ((_Rb_tree_header *)cVar4._M_node == &(switch_->body_)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    local_68.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = &std::
              map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
              ::at(this_00,&local_68)->
              super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)auStack_48,
               p_Var5);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    process_stmt(local_50,(StmtBlock *)auStack_48,var);
  }
  else {
    p_Var6 = &(switch_->body_)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var3 = (switch_->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != p_Var6; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      if ((*(long *)(p_Var3 + 1) != 0) &&
         (lVar1 = *(long *)(*(long *)(p_Var3 + 1) + 0x270),
         iVar2 = (*(((Var *)auStack_48)->super_IRNode)._vptr_IRNode[7])(auStack_48),
         oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload ==
         (ulong)(lVar1 << ((byte)iVar2 & 0x3f)) >> ((byte)iVar2 & 0x3f))) {
        process_stmt(local_50,(StmtBlock *)p_Var3[1]._M_left,var);
        return;
      }
    }
    auStack_48 = (undefined1  [8])0x0;
    stmt.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    cVar4 = std::
            _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
            ::find(&this_00->_M_t,(key_type *)auStack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
    if ((_Rb_tree_header *)cVar4._M_node == p_Var6) {
      return;
    }
    local_68.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = &std::
              map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
              ::at(this_00,&local_68)->
              super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)auStack_48,
               p_Var5);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    process_stmt(local_50,(StmtBlock *)auStack_48,var);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  return;
}

Assistant:

void Simulator::process_stmt(kratos::SwitchStmt *switch_, const Var *var) {
    auto *target = switch_->target().get();
    auto val = get_value_(target);
    auto const &body = switch_->body();
    if (!val) {
        // go to default case
        if (body.find(nullptr) != body.end()) {
            auto stmt = body.at(nullptr);
            process_stmt(stmt.get(), var);
        }
    } else {
        auto value = *val;
        for (auto const &[cond, stmt] : body) {
            // we compare bits
            if (!cond) continue;
            int64_t cond_val = cond->value();
            int64_t *v_p = &cond_val;
            uint64_t bits = *(reinterpret_cast<uint64_t *>(v_p));
            bits &= (0xFFFFFFFFFFFFFFFF >> target->width());
            if (value == bits) {
                process_stmt(stmt.get(), var);
                return;
            }
        }
        // default case
        if (body.find(nullptr) != body.end()) {
            auto stmt = body.at(nullptr);
            process_stmt(stmt.get(), var);
        }
    }
}